

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[63],kj::String&,char_const(&)[7]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [63],String *params_1,
          char (*params_2) [7])

{
  Branch *pBVar1;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  
  local_48 = toCharSequence<char_const(&)[63]>((char (*) [63])this);
  pBVar1 = *(Branch **)(*params + 8);
  local_28.ptr = (char *)pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_28.ptr = *(char **)*params;
  }
  local_28.size_ = (size_t)(undefined1 *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_28.size_ = (size_t)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_38 = toCharSequence<char_const(&)[7]>((char (*) [7])params_1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_28,&local_38,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}